

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O0

void pnga_strided_put(Integer g_a,Integer *lo,Integer *hi,Integer *skip,void *buf,Integer *ld)

{
  int iVar1;
  int iVar2;
  Integer IVar3;
  Integer *in_RCX;
  Integer *in_RSI;
  long in_RDI;
  long in_R8;
  Integer *in_R9;
  _iterator_hdl it_hdl;
  int ndim;
  int proc;
  int i;
  int stride_loc [14];
  int stride_rem [14];
  int count [14];
  char *prem;
  char *pbuf;
  Integer phi [7];
  _iterator_hdl *in_stack_00000428;
  Integer plo [7];
  Integer *bhi;
  Integer *blo;
  Integer idx_buf;
  Integer ldrem [7];
  Integer nproc;
  Integer p_handle;
  Integer nstride;
  Integer size;
  Integer idx;
  Integer handle;
  Integer np;
  Integer p;
  Integer *pIVar4;
  int *in_stack_fffffffffffffae0;
  int *in_stack_fffffffffffffae8;
  void *in_stack_fffffffffffffaf0;
  int *in_stack_fffffffffffffaf8;
  void *in_stack_fffffffffffffb00;
  int in_stack_fffffffffffffb10;
  Integer in_stack_fffffffffffffc78;
  char *in_stack_fffffffffffffc80;
  _iterator_hdl *in_stack_fffffffffffffcd8;
  Integer *in_stack_fffffffffffffce0;
  Integer *in_stack_fffffffffffffce8;
  Integer in_stack_fffffffffffffcf0;
  int local_20c;
  int local_208 [16];
  int local_1c8 [16];
  int local_188 [16];
  long local_148;
  long local_140;
  Integer local_138 [8];
  Integer local_f8 [7];
  long local_c0;
  Integer *local_b8;
  long local_b0;
  Integer local_a8 [7];
  Integer local_70;
  long local_68;
  Integer local_60;
  long local_58;
  long local_48;
  undefined8 local_40;
  Integer *local_30;
  long local_28;
  Integer *local_20;
  Integer *local_10;
  
  local_40 = 0;
  local_48 = in_RDI + 1000;
  local_58 = (long)GA[local_48].elemsize;
  iVar1 = (int)GA[local_48].ndim;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_70 = pnga_nnodes();
  local_68 = (long)GA[local_48].p_handle;
  for (local_20c = 0; local_20c < iVar1; local_20c = local_20c + 1) {
    if (local_20[local_20c] < 1) {
      pnga_error(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    }
  }
  gai_iterator_init(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                    in_stack_fffffffffffffcd8);
  while (iVar2 = gai_iterator_next(in_stack_00000428,(int *)phi[6],(Integer **)phi[5],
                                   (Integer **)phi[4],(char **)phi[3],(Integer *)phi[2]), iVar2 != 0
        ) {
    for (local_20c = 0; local_20c < iVar1; local_20c = local_20c + 1) {
      local_f8[local_20c] = local_b8[local_20c];
      local_138[local_20c] = *(Integer *)(local_c0 + (long)local_20c * 8);
    }
    IVar3 = gai_correct_strided_patch((long)iVar1,local_10,local_20,local_f8,local_138);
    if (IVar3 != 0) {
      gai_FindOffset((long)iVar1,local_b8,local_f8,local_a8,&local_b0);
      local_148 = local_58 * local_b0 + local_148;
      gai_ComputePatchIndexWithSkip((long)iVar1,local_10,local_f8,local_20,local_30,&local_b0);
      local_140 = local_58 * local_b0 + local_28;
      iVar2 = gai_ComputeCountWithSkip((long)iVar1,local_f8,local_138,local_20,local_188,&local_60);
      if (iVar2 != 0) {
        local_188[0] = local_188[0] * (int)local_58;
        pIVar4 = local_20;
        gai_SetStrideWithSkip((long)iVar1,local_58,local_30,local_a8,local_1c8,local_208,local_20);
        ARMCI_PutS(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,
                   in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,(int)((ulong)pIVar4 >> 0x20),
                   in_stack_fffffffffffffb10);
      }
    }
  }
  gai_iterator_destroy((_iterator_hdl *)0x238a19);
  return;
}

Assistant:

void pnga_strided_put(Integer g_a, Integer *lo, Integer *hi, Integer *skip,
                     void    *buf, Integer *ld)
{
  /* g_a:    Global Array handle
     lo[]:   Array of lower indices of patch of global array
     hi[]:   Array of upper indices of patch of global array
     skip[]: Array of skips for each dimension
     buf[]:  Local buffer that patch will be copied from
     ld[]:   ndim-1 physical dimensions of local buffer */
  Integer p, np=0, handle = GA_OFFSET + g_a;
  Integer idx, size, nstride, p_handle, nproc;
  Integer ldrem[MAXDIM];
  Integer idx_buf, *blo, *bhi;
  Integer plo[MAXDIM],phi[MAXDIM];
  char *pbuf, *prem;
  int count[2*MAXDIM], stride_rem[2*MAXDIM], stride_loc[2*MAXDIM];
  int i, proc, ndim;
  _iterator_hdl it_hdl;

  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  nproc = pnga_nnodes();
  p_handle = GA[handle].p_handle;

  /* check values of skips to make sure they are legitimate */
  for (i = 0; i<ndim; i++) {
    if (skip[i]<1) {
      pnga_error("nga_strided_put: Invalid value of skip along coordinate ",i);
    }
  }

  gai_iterator_init(g_a, lo, hi, &it_hdl);
  while (gai_iterator_next(&it_hdl, &proc, &blo, &bhi, &prem, ldrem)) {
      /* Correct ranges to account for skips in original patch. If no
         data is left in patch jump to next processor in loop. */
      for (i=0; i<ndim; i++) {
        plo[i] = blo[i];
        phi[i] = bhi[i];
      }
      if (!gai_correct_strided_patch((Integer)ndim, lo, skip, plo, phi))
        continue;
      /* May need to correct location of remote buffer */
      gai_FindOffset(ndim,blo,plo,ldrem,&idx_buf);
      prem += size*idx_buf;

      /* get pointer in local buffer to point indexed by plo given that
         the corner of the buffer corresponds to the point indexed by lo */
      gai_ComputePatchIndexWithSkip(ndim, lo, plo, skip, ld, &idx_buf);
      pbuf = size*idx_buf + (char*)buf;

      /* Compute number of elements in each stride region and compute the
         number of stride regions. Store the results in count and nstride */
      if (!gai_ComputeCountWithSkip(ndim, plo, phi, skip, count, &nstride))
        continue;

      /* Scale first element in count by element size. The ARMCI_PutS routine
         uses this convention to figure out memory sizes. */
      count[0] *= size;

      /* Calculate strides in memory for remote processor indexed by proc and
         local buffer */ 
      gai_SetStrideWithSkip(ndim, size, ld, ldrem, stride_rem, stride_loc,
          skip);

      /* BJP */
      if (p_handle != -1) {
        proc = PGRP_LIST[p_handle].inv_map_proc_list[proc];
      }
      ARMCI_PutS(pbuf, stride_loc, prem, stride_rem, count, nstride-1, proc);
  }
  gai_iterator_destroy(&it_hdl);
}